

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::unwind_rparen(jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *this,error_code *ec)

{
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *ptVar1;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *ptVar2;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *ptVar3;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *__args;
  
  ptVar3 = (this->operator_stack_).
           super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __args = (this->operator_stack_).
           super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((__args != ptVar3) && (__args[-1].token_kind_ != lparen)) {
    ptVar2 = __args;
    do {
      __args = ptVar2 + -1;
      std::
      vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>
      ::
      emplace_back<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>
                ((vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>
                  *)&this->output_stack_,__args);
      ptVar3 = (this->operator_stack_).
               super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (__args == ptVar3) break;
      ptVar1 = ptVar2 + -2;
      ptVar2 = __args;
    } while (ptVar1->token_kind_ != lparen);
  }
  if (__args != ptVar3) {
    std::
    vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
    ::_M_erase(&this->operator_stack_,__args + -1,
               (this->operator_stack_).
               super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  std::error_code::operator=(ec,unbalanced_parentheses);
  return;
}

Assistant:

void unwind_rparen(std::error_code& ec)
        {
            auto it = operator_stack_.rbegin();
            while (it != operator_stack_.rend() && !(*it).is_lparen())
            {
                output_stack_.emplace_back(std::move(*it));
                ++it;
            }
            if (it == operator_stack_.rend())
            {
                ec = jsonpath_errc::unbalanced_parentheses;
                return;
            }
            ++it;
            operator_stack_.erase(it.base(),operator_stack_.end());
        }